

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

bool __thiscall
ctemplate::SectionTemplateNode::AddTextNode
          (SectionTemplateNode *this,TemplateToken *token,Template *my_template)

{
  ulong uVar1;
  int iVar2;
  TextTemplateNode *this_00;
  ostream *poVar3;
  char *pcVar4;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [8];
  string error_msg;
  TextTemplateNode *local_38;
  HtmlParser *local_30;
  HtmlParser *htmlparser;
  Template *pTStack_20;
  bool success;
  Template *my_template_local;
  TemplateToken *token_local;
  SectionTemplateNode *this_local;
  
  pTStack_20 = my_template;
  my_template_local = (Template *)token;
  token_local = (TemplateToken *)this;
  if (token == (TemplateToken *)0x0) {
    __assert_fail("token",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                  ,0x603,
                  "bool ctemplate::SectionTemplateNode::AddTextNode(const TemplateToken *, Template *)"
                 );
  }
  htmlparser._7_1_ = 1;
  local_30 = my_template->htmlparser_;
  if (token->textlen != 0) {
    this_00 = (TextTemplateNode *)operator_new(0x38);
    TextTemplateNode::TextTemplateNode(this_00,(TemplateToken *)my_template_local);
    local_38 = this_00;
    std::__cxx11::list<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>::
    push_back(&this->node_list_,(value_type *)&local_38);
    if (((pTStack_20->initial_context_ == TC_HTML) || (pTStack_20->initial_context_ == TC_JS)) ||
       (pTStack_20->initial_context_ == TC_CSS)) {
      if (local_30 == (HtmlParser *)0x0) {
        __assert_fail("htmlparser",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                      ,0x60a,
                      "bool ctemplate::SectionTemplateNode::AddTextNode(const TemplateToken *, Template *)"
                     );
      }
      iVar2 = ctemplate_htmlparser::HtmlParser::state(local_30);
      if ((iVar2 == 7) ||
         (iVar2 = ctemplate_htmlparser::HtmlParser::Parse
                            (local_30,*(char **)&my_template_local->original_filename_,
                             (int)*(undefined8 *)&my_template_local->field_0x10), iVar2 == 7)) {
        pcVar4 = *(char **)&my_template_local->original_filename_;
        uVar1 = *(ulong *)&my_template_local->field_0x10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c8,pcVar4,uVar1,&local_c9);
        std::operator+((char *)local_a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Failed parsing: ");
        std::operator+(local_88,(char *)local_a8);
        pcVar4 = (this->token_).text;
        uVar1 = (this->token_).textlen;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f0,pcVar4,uVar1,&local_f1);
        std::operator+(local_68,local_88);
        std::__cxx11::string::~string(local_f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
        std::__cxx11::string::~string((string *)local_88);
        std::__cxx11::string::~string(local_a8);
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
        poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
        poVar3 = std::operator<<(poVar3,"Template ");
        pcVar4 = Template::template_file(pTStack_20);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::operator<<(poVar3,": ");
        poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
        poVar3 = std::operator<<(poVar3,"Auto-Escape: ");
        poVar3 = std::operator<<(poVar3,(string *)local_68);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        htmlparser._7_1_ = 0;
        std::__cxx11::string::~string((string *)local_68);
      }
    }
  }
  return (bool)(htmlparser._7_1_ & 1);
}

Assistant:

bool SectionTemplateNode::AddTextNode(const TemplateToken* token,
                                      Template* my_template) {
  assert(token);
  bool success = true;
  HtmlParser *htmlparser = my_template->htmlparser_;

  if (token->textlen > 0) {  // ignore null text sections
    node_list_.push_back(new TextTemplateNode(*token));
    if (AUTO_ESCAPE_PARSING_CONTEXT(my_template->initial_context_)) {
      assert(htmlparser);
      if (htmlparser->state() == HtmlParser::STATE_ERROR ||
          htmlparser->Parse(token->text, static_cast<int>(token->textlen)) ==
          HtmlParser::STATE_ERROR) {
        string error_msg =  "Failed parsing: " +
            string(token->text, token->textlen) +
            "\nIn: " + string(token_.text, token_.textlen);
        LOG_AUTO_ESCAPE_ERROR(error_msg, my_template);
        success = false;
      }
    }
  }
  return success;
}